

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.cpp
# Opt level: O0

void __thiscall vera::Pyramid::process(Pyramid *this,Fbo *_input)

{
  uint local_1c;
  uint i;
  Fbo *_input_local;
  Pyramid *this_local;
  
  std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
            (&this->pass,this->m_downs,_input,(Fbo *)0x0,0);
  for (local_1c = 1; local_1c < this->m_depth; local_1c = local_1c + 1) {
    std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
              (&this->pass,this->m_downs + local_1c,this->m_downs + (local_1c - 1),(Fbo *)0x0,
               local_1c);
  }
  std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
            (&this->pass,this->m_ups,this->m_downs + (this->m_depth - 2),
             this->m_downs + (this->m_depth - 1),this->m_depth - 1);
  for (local_1c = 1; local_1c < this->m_depth - 1; local_1c = local_1c + 1) {
    std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
              (&this->pass,this->m_ups + local_1c,this->m_downs + ((this->m_depth - local_1c) - 2),
               this->m_ups + (local_1c - 1),(this->m_depth - 1) - local_1c);
  }
  std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
            (&this->pass,this->m_ups + (this->m_depth - 1),_input,this->m_ups + (this->m_depth - 2),
             0);
  return;
}

Assistant:

void Pyramid::process(const vera::Fbo *_input) {
    unsigned int i;
    // Copy the input to the first downscale
    pass(&m_downs[0], _input, NULL, 0);

    // DOWNSCALE
    for (i = 1; i < m_depth; i++)
        pass(&m_downs[i], &(m_downs[i-1]), NULL, i);
    
    // Copy the last downscale to the first upscale
    pass(&m_ups[0], &(m_downs[m_depth-2]), &(m_downs[m_depth-1]), m_depth-1);
    
    // UPSCALE
    for (i = 1; i < m_depth-1; i++)
        pass(&m_ups[i], &(m_downs[m_depth-i-2]), &(m_ups[i-1]), m_depth-1-i);
    
    // Copy the last upscale to the output
    pass(&m_ups[m_depth-1], _input, &(m_ups[m_depth-2]), 0);
}